

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

void DumpPtr(textwriter *Text,tchar_t *Name,node *Node,dataid Id,tchar_t *Value,size_t ValueLen)

{
  fourcc_t ClassId;
  node *Node_local;
  
  Node_local = Node;
  TextAttrib(Text,Name,&Node_local,0xf);
  if (Node_local != (node *)0x0) {
    ClassId = *(fourcc_t *)((long)Node_local->VMT + 8);
    tcscpy_s(Value,0x140,Name);
    tcscat_s(Value,0x140,"_Class");
    TextAttrib(Text,Value,&ClassId,8);
  }
  if (Id != 0) {
    ClassId = (fourcc_t)Id;
    tcscpy_s(Value,0x140,Name);
    tcscat_s(Value,0x140,"_Id");
    TextAttrib(Text,Value,&ClassId,2);
  }
  return;
}

Assistant:

static NOINLINE void DumpPtr(textwriter* Text, const tchar_t* Name, node* Node, dataid Id, tchar_t* Value, size_t ValueLen)
{
    TextAttrib(Text,Name,&Node,TYPE_PTR);

    if (Node)
    {
        fourcc_t ClassId = Node_ClassId(Node);
        tcscpy_s(Value,ValueLen,Name);
        tcscat_s(Value,ValueLen,T("_Class"));
        TextAttrib(Text,Value,&ClassId,TYPE_FOURCC);
    }

    if (Id)
    {
        int i = (int)Id;
        tcscpy_s(Value,ValueLen,Name);
        tcscat_s(Value,ValueLen,T("_Id"));
        TextAttrib(Text,Value,&i,TYPE_INT);
    }
}